

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O2

char * corpus_utt_brief_name(void)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  
  pcVar2 = cur_ctl_path;
  pcVar7 = "N/A";
  if ((cur_ctl_path != (char *)0x0) && (sVar4 = strlen(cur_ctl_path), sVar4 != 0)) {
    lVar5 = (sVar4 << 0x20) + 0x100000000;
    iVar3 = 2;
    lVar6 = (long)(int)sVar4;
    do {
      lVar1 = lVar6 + -1;
      lVar5 = lVar5 + -0x100000000;
      if (lVar6 < 2) break;
      iVar3 = iVar3 - (uint)(pcVar2[lVar6 + -1] == '/');
      lVar6 = lVar1;
    } while (iVar3 != 0);
    pcVar7 = pcVar2;
    if (lVar1 != 0) {
      pcVar7 = pcVar2 + (lVar5 >> 0x20);
    }
  }
  return pcVar7;
}

Assistant:

char *corpus_utt_brief_name()
{
    int need_slash = 2;
    int i;

    if (cur_ctl_path && strlen(cur_ctl_path) > 0) {
	i = strlen(cur_ctl_path);
	do {
	    if (cur_ctl_path[--i] == '/')
		--need_slash;
	} while ((i > 0) && need_slash);
	
	if (i == 0)
	    return cur_ctl_path;
	else
	    return &cur_ctl_path[i+1];
    }
    else
	return "N/A";
}